

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::readValue(Reader *this)

{
  Location pCVar1;
  _Elt_pointer ppVVar2;
  Location pCVar3;
  bool bVar4;
  _Elt_pointer ppVVar5;
  _Elt_pointer ppVVar6;
  Value v;
  Token token;
  allocator local_51;
  ValueHolder local_50;
  undefined2 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  Token local_28;
  
  if (999 < stackDepth_g) {
    std::__cxx11::string::string
              ((string *)&local_50.bool_,"Exceeded stackLimit in readValue().",
               (allocator *)&local_28);
    throwRuntimeError((string *)&local_50);
  }
  stackDepth_g = stackDepth_g + 1;
  skipCommentTokens(this,&local_28);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar5[-1],&this->commentsBefore_,commentBefore);
    std::__cxx11::string::assign((char *)&this->commentsBefore_);
  }
  switch(local_28.type_) {
  case tokenObjectBegin:
    bVar4 = readObject(this,&local_28);
    goto LAB_0010a607;
  case tokenObjectEnd:
  case tokenArrayEnd:
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_0010a482_default;
    this->current_ = this->current_ + -1;
    local_48 = 0;
    local_30 = 0;
    local_40 = 0;
    uStack_38 = 0;
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)&local_50);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar6 = ppVVar5;
    if (ppVVar5 == ppVVar2) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar3 = this->begin_;
    pCVar1 = this->current_;
    ppVVar6[-1]->start_ = (ptrdiff_t)(pCVar1 + ~(ulong)pCVar3);
    if (ppVVar5 == ppVVar2) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar5[-1]->limit_ = (long)pCVar1 - (long)pCVar3;
    goto LAB_0010a6fc;
  case tokenArrayBegin:
    bVar4 = readArray(this,&local_28);
LAB_0010a607:
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar5[-1]->limit_ = (long)this->current_ - (long)this->begin_;
    goto LAB_0010a708;
  case tokenString:
    bVar4 = decodeString(this,&local_28);
    goto LAB_0010a708;
  case tokenNumber:
    bVar4 = decodeNumber(this,&local_28);
    goto LAB_0010a708;
  case tokenTrue:
    local_48 = 5;
    local_50.bool_ = true;
    break;
  case tokenFalse:
    local_48 = 5;
    local_50.bool_ = false;
    break;
  case tokenNull:
    local_48 = 0;
    break;
  default:
switchD_0010a482_default:
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar6 = ppVVar5;
    if (ppVVar5 == ppVVar2) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar3 = this->begin_;
    ppVVar6[-1]->start_ = (long)local_28.start_ - (long)pCVar3;
    if (ppVVar5 == ppVVar2) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar5[-1]->limit_ = (long)local_28.end_ - (long)pCVar3;
    std::__cxx11::string::string
              ((string *)&local_50.bool_,"Syntax error: value, object or array expected.",&local_51)
    ;
    addError(this,(string *)&local_50,&local_28,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_50.bool_);
    return false;
  }
  local_30 = 0;
  uStack_38 = 0;
  local_40 = 0;
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar5 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar5[-1],(Value *)&local_50);
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVVar6 = ppVVar5;
  if (ppVVar5 == ppVVar2) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pCVar3 = this->begin_;
  ppVVar6[-1]->start_ = (long)local_28.start_ - (long)pCVar3;
  if (ppVVar5 == ppVVar2) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar5[-1]->limit_ = (long)local_28.end_ - (long)pCVar3;
LAB_0010a6fc:
  Value::~Value((Value *)&local_50);
  bVar4 = true;
LAB_0010a708:
  if (this->collectComments_ == true) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar5[-1];
  }
  stackDepth_g = stackDepth_g + -1;
  return bVar4;
}

Assistant:

bool Reader::readValue() {
  // This is a non-reentrant way to support a stackLimit. Terrible!
  // But this deprecated class has a security problem: Bad input can
  // cause a seg-fault. This seems like a fair, binary-compatible way
  // to prevent the problem.
  if (stackDepth_g >= stackLimit_g) throwRuntimeError("Exceeded stackLimit in readValue().");
  ++stackDepth_g;

  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenFalse:
    {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenNull:
    {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  --stackDepth_g;
  return successful;
}